

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.h
# Opt level: O2

Float __thiscall pbrt::ImageChannelValues::Average(ImageChannelValues *this)

{
  anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
  *paVar1;
  size_t sVar2;
  int i;
  size_t sVar3;
  anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
  *paVar4;
  float fVar5;
  
  paVar1 = (anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
            *)(this->super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>).ptr;
  sVar2 = (this->super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>).nStored;
  fVar5 = 0.0;
  paVar4 = &(this->super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>).field_2;
  if (paVar1 != (anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
                 *)0x0) {
    paVar4 = paVar1;
  }
  for (sVar3 = 0; sVar2 != sVar3; sVar3 = sVar3 + 1) {
    fVar5 = fVar5 + paVar4->fixed[sVar3];
  }
  return fVar5 / (float)(long)sVar2;
}

Assistant:

Float Average() const {
        Float sum = 0;
        for (int i = 0; i < size(); ++i)
            sum += (*this)[i];
        return sum / size();
    }